

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O0

void xemmai::ast::anon_unknown_11::f_emit_block_without_value
               (t_emit *a_emit,
               vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
               *a_nodes)

{
  bool bVar1;
  reference this;
  pointer ptVar2;
  unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
  *__range2;
  vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
  *a_nodes_local;
  t_emit *a_emit_local;
  
  __end2 = std::
           vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
           ::begin(a_nodes);
  p = (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
      std::
      vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
      ::end(a_nodes);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
                      (&__end2,(__normal_iterator<const_std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
                                *)&p);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this = __gnu_cxx::
           __normal_iterator<const_std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
           ::operator*(&__end2);
    ptVar2 = std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
             operator->(this);
    (*ptVar2->_vptr_t_node[3])(ptVar2,a_emit,0,0,1);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_*,_std::vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void f_emit_block_without_value(t_emit& a_emit, const std::vector<std::unique_ptr<t_node>>& a_nodes)
{
	for (auto& p : a_nodes) p->f_emit(a_emit, false, false, true);
}